

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<long,2ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<long,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_2UL>_>_>_>
          *result)

{
  bool bVar1;
  StreamReader *pSVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char c;
  array<long,_2UL> value;
  char local_61;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  array<long,_2UL> local_40;
  
  if (*(long *)(result + 8) != *(long *)result) {
    *(long *)(result + 8) = *(long *)result;
  }
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (!bVar1) {
    return false;
  }
  bVar1 = MaybeNone(this);
  if (bVar1) {
    local_60._0_8_ = local_60._0_8_ & 0xffffffffffffff00;
    local_60._8_4_ = 0;
    local_60._12_4_ = 0;
    aStack_50._M_allocated_capacity._0_4_ = 0;
    aStack_50._M_allocated_capacity._4_4_ = 0;
  }
  else {
    bVar1 = ParseBasicTypeTuple<long,2ul>(this,&local_40);
    if (!bVar1) {
      pcVar5 = "Not starting with the tuple value of requested type.\n";
      pcVar4 = "";
      goto LAB_00375584;
    }
    local_60[0] = 1;
    local_60._8_4_ = (undefined4)local_40._M_elems[0];
    local_60._12_4_ = local_40._M_elems[0]._4_4_;
    aStack_50._M_allocated_capacity._0_4_ = (undefined4)local_40._M_elems[1];
    aStack_50._M_allocated_capacity._4_4_ = local_40._M_elems[1]._4_4_;
  }
  ::std::
  vector<nonstd::optional_lite::optional<std::array<long,2ul>>,std::allocator<nonstd::optional_lite::optional<std::array<long,2ul>>>>
  ::emplace_back<nonstd::optional_lite::optional<std::array<long,2ul>>>
            ((vector<nonstd::optional_lite::optional<std::array<long,2ul>>,std::allocator<nonstd::optional_lite::optional<std::array<long,2ul>>>>
              *)result,(optional<std::array<long,_2UL>_> *)local_60);
  pSVar2 = this->_sr;
  uVar3 = pSVar2->idx_;
  if (uVar3 < pSVar2->length_) {
    while (pSVar2->binary_[uVar3] != '\0') {
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = Char1(this,&local_61);
      if (!bVar1) {
        return false;
      }
      if (local_61 != sep) {
        pSVar2 = this->_sr;
        if ((0 < (long)pSVar2->idx_) && (uVar3 = pSVar2->idx_ - 1, uVar3 <= pSVar2->length_)) {
          pSVar2->idx_ = uVar3;
        }
        break;
      }
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = MaybeNone(this);
      if (bVar1) {
        local_60._0_8_ = local_60._0_8_ & 0xffffffffffffff00;
        local_60._8_4_ = 0;
        local_60._12_4_ = 0;
        aStack_50._M_allocated_capacity._0_4_ = 0;
        aStack_50._M_allocated_capacity._4_4_ = 0;
      }
      else {
        bVar1 = ParseBasicTypeTuple<long,2ul>(this,&local_40);
        if (!bVar1) break;
        local_60[0] = 1;
        local_60._8_4_ = (undefined4)local_40._M_elems[0];
        local_60._12_4_ = local_40._M_elems[0]._4_4_;
        aStack_50._M_allocated_capacity._0_4_ = (undefined4)local_40._M_elems[1];
        aStack_50._M_allocated_capacity._4_4_ = local_40._M_elems[1]._4_4_;
      }
      ::std::
      vector<nonstd::optional_lite::optional<std::array<long,2ul>>,std::allocator<nonstd::optional_lite::optional<std::array<long,2ul>>>>
      ::emplace_back<nonstd::optional_lite::optional<std::array<long,2ul>>>
                ((vector<nonstd::optional_lite::optional<std::array<long,2ul>>,std::allocator<nonstd::optional_lite::optional<std::array<long,2ul>>>>
                  *)result,(optional<std::array<long,_2UL>_> *)local_60);
      pSVar2 = this->_sr;
      uVar3 = pSVar2->idx_;
      if (pSVar2->length_ <= uVar3) break;
    }
  }
  if (*(long *)result != *(long *)(result + 8)) {
    return true;
  }
  pcVar5 = "Empty array.\n";
  pcVar4 = "";
LAB_00375584:
  local_60._0_8_ = &aStack_50;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,pcVar5,pcVar4);
  PushError(this,(string *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._0_8_ != &aStack_50) {
    operator_delete((void *)local_60._0_8_,
                    CONCAT44(aStack_50._M_allocated_capacity._4_4_,
                             aStack_50._M_allocated_capacity._0_4_) + 1);
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}